

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

double relive::LogManager::log(double __x)

{
  bool bVar1;
  __pid_t _Var2;
  LogManager *this;
  ostream *poVar3;
  uint64_t uVar4;
  rep rVar5;
  tm *__tmb;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  char cVar7;
  int in_ECX;
  string *in_RDX;
  string *in_RSI;
  undefined4 in_EDI;
  string *in_R8;
  int in_R9D;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar8;
  string *in_stack_00000008;
  mutex_type *in_stack_fffffffffffffcd8;
  lock_guard<std::mutex> *in_stack_fffffffffffffce0;
  string local_268 [32];
  int local_248;
  char local_241;
  _Put_time<char> local_240;
  time_t local_230;
  time_t time;
  long local_220;
  rep millis;
  duration duration;
  time_point now;
  stringstream local_200 [4];
  int fields;
  stringstream ss;
  ostream local_1f0;
  lock_guard<std::mutex> lock;
  string local_60;
  LogManager *local_40;
  LogManager *logManager;
  string *psStack_30;
  int level_local;
  string *function_local;
  string *psStack_20;
  int line_local;
  string *file_local;
  string *className_local;
  LogType type_local;
  
  logManager._4_4_ = in_R9D;
  psStack_30 = in_R8;
  function_local._4_4_ = in_ECX;
  psStack_20 = in_RDX;
  file_local = in_RSI;
  className_local._4_4_ = in_EDI;
  std::__cxx11::string::string((string *)&local_60);
  this = instance(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  local_40 = this;
  bVar1 = isActive(this,file_local,logManager._4_4_);
  dVar8 = extraout_XMM0_Qa;
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    std::__cxx11::stringstream::stringstream(local_200);
    std::operator<<(&local_1f0,"[");
    if ((local_40->_logStyle & 1U) != 0) {
      _Var2 = getpid();
      poVar3 = (ostream *)std::ostream::operator<<(&local_1f0,_Var2);
      std::operator<<(poVar3,":");
    }
    if ((local_40->_logStyle & 2U) != 0) {
      uVar4 = symbolicThreadId(local_40);
      poVar3 = (ostream *)std::ostream::operator<<(&local_1f0,uVar4);
      std::operator<<(poVar3,":");
    }
    if ((local_40->_logStyle & 4U) != 0) {
      switch(className_local._4_4_) {
      case 0:
        std::operator<<(&local_1f0,"ERROR: ");
        break;
      case 1:
        std::operator<<(&local_1f0,"WARNING: ");
        break;
      case 2:
        std::operator<<(&local_1f0,"INFO: ");
        break;
      case 3:
        std::operator<<(&local_1f0,"DEBUG: ");
      }
    }
    bVar1 = (local_40->_logStyle & 8U) != 0;
    if (bVar1) {
      duration.__r = std::chrono::_V2::system_clock::now();
      millis = (rep)std::chrono::
                    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&duration);
      time = (time_t)std::chrono::
                     duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_> *)&millis);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000L>_> *)&time);
      local_220 = rVar5 % 1000;
      local_230 = std::chrono::_V2::system_clock::to_time_t((time_point *)&duration);
      __tmb = localtime(&local_230);
      local_240 = std::put_time<char>((tm *)__tmb,"%FT%T.");
      pbVar6 = std::operator<<(&local_1f0,local_240);
      local_241 = (char)std::setfill<char>('0');
      poVar3 = std::operator<<(pbVar6,local_241);
      local_248 = (int)std::setw(3);
      poVar3 = std::operator<<(poVar3,(_Setw)local_248);
      std::ostream::operator<<(poVar3,local_220);
    }
    cVar7 = bVar1;
    if ((local_40->_logStyle & 0x20U) != 0) {
      cVar7 = bVar1 + '\x01';
      if (bVar1) {
        std::operator<<(&local_1f0,", ");
      }
      std::operator<<(&local_1f0,psStack_20);
    }
    if ((local_40->_logStyle & 0x40U) != 0) {
      if ((local_40->_logStyle & 0x20U) == 0) {
        if (cVar7 != '\0') {
          std::operator<<(&local_1f0,", line ");
        }
      }
      else {
        std::operator<<(&local_1f0,":");
      }
      std::ostream::operator<<(&local_1f0,function_local._4_4_);
      cVar7 = cVar7 + '\x01';
    }
    if ((local_40->_logStyle & 0x10U) != 0) {
      if (cVar7 != '\0') {
        std::operator<<(&local_1f0,", ");
      }
      poVar3 = std::operator<<(&local_1f0,"[");
      poVar3 = std::operator<<(poVar3,psStack_30);
      std::operator<<(poVar3,"]");
    }
    std::operator<<(&local_1f0,"] ");
    poVar3 = local_40->_os;
    std::__cxx11::stringstream::str();
    poVar3 = std::operator<<(poVar3,local_268);
    poVar3 = std::operator<<(poVar3,in_stack_00000008);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::stringstream::~stringstream(local_200);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2769de);
    dVar8 = extraout_XMM0_Qa_00;
  }
  return dVar8;
}

Assistant:

void LogManager::log(LogType type, const std::string& className, const std::string& file, int line, const std::string& function, int level, const std::string& message)
{
    LogManager* logManager = instance();
    if(logManager->isActive(className, level))
    {
        std::lock_guard<std::mutex> lock(logManager->_mutex);
        std::stringstream ss;
        int fields = 0;
        ss << "[";
#ifndef _WIN32
        if (logManager->_logStyle & eShowPID) {
            ss << getpid() << ":";
        }
        if (logManager->_logStyle & eShowTID) {
            ss << logManager->symbolicThreadId() << ":";
        }
#if 0
#if defined(__APPLE__) && defined(__MACH__)
        if (logManager->_logStyle & eShowTID) {
            //ss << pthread_mach_thread_np(pthread_self()) << ":";
            ss << std::this_thread::get_id() << ":";
        }
#else
        if (logManager->_logStyle & eShowTID) {
            ss << pthread_self() << ":";
        }
#endif
#endif
#endif
        if (logManager->_logStyle & eShowType) {
            switch (type) {
                case LogType::eError:
                    ss << "ERROR: ";
                    break;
                case LogType::eWarning:
                    ss << "WARNING: ";
                    break;
                case LogType::eInfo:
                    ss << "INFO: ";
                    break;
                case LogType::eDebug:
                    ss << "DEBUG: ";
                    break;
            }
        }
        if (logManager->_logStyle & eShowTimestamp) {
            auto now = std::chrono::system_clock::now();
            auto duration = now.time_since_epoch();
            auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(duration).count() % 1000;
            const time_t time = std::chrono::system_clock::to_time_t(now);
            ss << std::put_time(std::localtime(&time), "%FT%T.") << std::setfill('0') << std::setw(3) << millis;
            ++fields;
        }
        if (logManager->_logStyle & eShowFile) {
            if (fields++) {
                ss << ", ";
            }
            ss << file;
        }
        if (logManager->_logStyle & eShowLine) {
            if (logManager->_logStyle & eShowFile) {
                ss << ":";
            } else if (fields) {
                ss << ", line ";
            }
            ss << line;
            ++fields;
        }
        if (logManager->_logStyle & eShowFunction) {
            if (fields++) {
                ss << ", ";
            }
            ss << "[" << function << "]";
        }
        ss << "] ";
        *logManager->_os << ss.str() << message << std::endl;
    }
}